

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O3

QcList * qc_list_create(int with_rwlock)

{
  undefined8 *puVar1;
  QcList *pQVar2;
  QcRWLock *pQVar3;
  QcList *extraout_RAX;
  long *plVar4;
  void *pvVar5;
  undefined8 *puVar6;
  undefined8 *extraout_RDX;
  long lVar7;
  long lVar8;
  long *plVar9;
  long *plVar10;
  
  plVar9 = (long *)0x1;
  lVar7 = 0x28;
  pQVar2 = (QcList *)calloc(1,0x28);
  if (pQVar2 != (QcList *)0x0) {
    if (with_rwlock != 0) {
      pQVar3 = qc_thread_rwlock_create();
      pQVar2->rwlock = pQVar3;
      if (pQVar3 == (QcRWLock *)0x0) {
        free(pQVar2);
        pQVar2 = (QcList *)0x0;
      }
    }
    return pQVar2;
  }
  qc_list_create_cold_1();
  if (plVar9 != (long *)0x0) {
    puVar6 = (undefined8 *)*plVar9;
    while (puVar6 != (undefined8 *)0x0) {
      puVar1 = (undefined8 *)*puVar6;
      free(puVar6);
      puVar6 = puVar1;
    }
    if ((QcRWLock *)plVar9[4] != (QcRWLock *)0x0) {
      qc_thread_rwlock_destroy((QcRWLock *)plVar9[4]);
    }
    free(plVar9);
    return extraout_RAX;
  }
  qc_list_destroy_cold_1();
  if (plVar9 != (long *)0x0) {
    return (QcList *)(ulong)*(uint *)(plVar9 + 3);
  }
  qc_list_count_cold_1();
  if (plVar9 == (long *)0x0) {
    qc_list_inserthead_cold_3();
    lVar8 = lVar7;
    plVar10 = plVar9;
LAB_001051e8:
    qc_list_inserthead_cold_2();
  }
  else {
    lVar8 = lVar7;
    plVar10 = plVar9;
    if (lVar7 == 0) goto LAB_001051e8;
    plVar10 = (long *)0x1;
    lVar8 = 0x18;
    plVar4 = (long *)calloc(1,0x18);
    if (plVar4 != (long *)0x0) {
      plVar4[2] = lVar7;
      lVar7 = *plVar9;
      *plVar4 = lVar7;
      if (lVar7 != 0) {
        *(long **)(lVar7 + 8) = plVar4;
      }
      if (plVar9[1] == 0) {
        plVar9[1] = (long)plVar4;
      }
      *plVar9 = (long)plVar4;
      *(int *)(plVar9 + 3) = (int)plVar9[3] + 1;
      return (QcList *)0x0;
    }
  }
  qc_list_inserthead_cold_1();
  if (plVar10 == (long *)0x0) {
    qc_list_inserttail_cold_3();
    lVar7 = lVar8;
    plVar9 = plVar10;
LAB_00105246:
    qc_list_inserttail_cold_2();
  }
  else {
    lVar7 = lVar8;
    plVar9 = plVar10;
    if (lVar8 == 0) goto LAB_00105246;
    plVar9 = (long *)0x1;
    lVar7 = 0x18;
    pvVar5 = calloc(1,0x18);
    if (pvVar5 != (void *)0x0) {
      *(long *)((long)pvVar5 + 0x10) = lVar8;
      plVar9 = (long *)plVar10[1];
      *(long **)((long)pvVar5 + 8) = plVar9;
      if (plVar9 == (long *)0x0) {
        plVar9 = plVar10;
      }
      *plVar9 = (long)pvVar5;
      plVar10[1] = (long)pvVar5;
      *(int *)(plVar10 + 3) = (int)plVar10[3] + 1;
      return (QcList *)0x0;
    }
  }
  qc_list_inserttail_cold_1();
  if (plVar9 == (long *)0x0) {
    qc_list_inserttail2_cold_3();
    plVar10 = plVar9;
  }
  else {
    plVar10 = plVar9;
    if (lVar7 != 0) {
      plVar10 = (long *)0x1;
      pvVar5 = calloc(1,0x18);
      if (pvVar5 != (void *)0x0) {
        *(long *)((long)pvVar5 + 0x10) = lVar7;
        plVar10 = (long *)plVar9[1];
        *(long **)((long)pvVar5 + 8) = plVar10;
        if (plVar10 == (long *)0x0) {
          plVar10 = plVar9;
        }
        *plVar10 = (long)pvVar5;
        plVar9[1] = (long)pvVar5;
        *(int *)(plVar9 + 3) = (int)plVar9[3] + 1;
        *extraout_RDX = pvVar5;
        return (QcList *)0x0;
      }
      goto LAB_001052af;
    }
  }
  qc_list_inserttail2_cold_2();
LAB_001052af:
  qc_list_inserttail2_cold_1();
  if (plVar10 != (long *)0x0) {
    plVar9 = (long *)*plVar10;
    if (plVar9 == (long *)0x0) {
      pQVar2 = (QcList *)0x0;
    }
    else {
      lVar7 = *plVar9;
      if ((long *)plVar10[2] == plVar9) {
        plVar10[2] = lVar7;
      }
      *plVar10 = lVar7;
      if (lVar7 != 0) {
        *(undefined8 *)(lVar7 + 8) = 0;
      }
      plVar4 = plVar10 + 3;
      *(int *)plVar4 = (int)*plVar4 + -1;
      if ((int)*plVar4 == 0) {
        plVar10[1] = 0;
      }
      pQVar2 = (QcList *)plVar9[2];
      free(plVar9);
    }
    return pQVar2;
  }
  qc_list_pophead_cold_1();
  if (plVar10 == (long *)0x0) {
    qc_list_poptail_cold_1();
    plVar10[2] = *plVar10;
    return (QcList *)*plVar10;
  }
  if ((void *)*plVar10 == (void *)0x0) {
    pQVar2 = (QcList *)0x0;
  }
  else {
    pvVar5 = (void *)plVar10[1];
    if ((void *)plVar10[2] == pvVar5) {
      plVar10[2] = 0;
    }
    if (pvVar5 == (void *)*plVar10) {
      *plVar10 = 0;
      puVar6 = *(undefined8 **)((long)pvVar5 + 8);
    }
    else {
      puVar6 = *(undefined8 **)((long)pvVar5 + 8);
      *puVar6 = 0;
    }
    plVar10[1] = (long)puVar6;
    *(int *)(plVar10 + 3) = (int)plVar10[3] + -1;
    pQVar2 = *(QcList **)((long)pvVar5 + 0x10);
    free(pvVar5);
  }
  return pQVar2;
}

Assistant:

QcList *qc_list_create(int with_rwlock)
{       
    QcList *list;

    qc_malloc(list, sizeof(struct __QcList));
    if(NULL == list)
    {
        return NULL;
    }

    list->head = NULL;
    list->tail = NULL;
    list->cur  = NULL;
    list->count = 0;
    list->rwlock = NULL;

    if(with_rwlock)
    {
        list->rwlock = qc_thread_rwlock_create();
        if(NULL == list->rwlock)
        {
            qc_free(list);
            return NULL;
        }
    }

    return list;
}